

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemporaryFile.hpp
# Opt level: O3

void __thiscall supermap::io::TemporaryFile::~TemporaryFile(TemporaryFile *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  path pStack_38;
  
  if (this->canceledDeletion_ == false) {
    peVar1 = (this->manager_).
             super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
              (&pStack_38,&this->path_,auto_format);
    (*peVar1->_vptr_FileManager[2])(peVar1,&pStack_38);
    std::filesystem::__cxx11::path::~path(&pStack_38);
  }
  this_00 = (this->manager_).
            super___shared_ptr<supermap::io::FileManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar2 = (this->path_)._M_dataplus._M_p;
  paVar3 = &(this->path_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~TemporaryFile() {
        if (!canceledDeletion_) {
            manager_->remove(path_);
        }
    }